

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O2

ostream * google::protobuf::operator<<(ostream *o,uint128 *b)

{
  uint *puVar1;
  uint uVar2;
  pointer pcVar3;
  uint128 dividend;
  ostream *poVar4;
  ostream *poVar5;
  char cVar6;
  ulong uVar7;
  long lVar8;
  uint128 divisor;
  uint128 divisor_00;
  long local_200;
  ostringstream os;
  uint auStack_1e8 [88];
  undefined1 auStack_88 [8];
  uint128 low;
  uint128 high;
  uint128 mid;
  string rep;
  
  uVar2 = *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18);
  if ((uVar2 & 0x4a) == 8) {
    rep.field_2._8_8_ = 0xf;
    uVar7 = 0x1000000000000000;
  }
  else if ((uVar2 & 0x4a) == 0x40) {
    rep.field_2._8_8_ = 0x15;
    uVar7 = 0x8000000000000000;
  }
  else {
    rep.field_2._8_8_ = 0x13;
    uVar7 = 10000000000000000000;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_200);
  *(uint *)((long)auStack_1e8 + *(long *)(local_200 + -0x18)) =
       *(uint *)((long)auStack_1e8 + *(long *)(local_200 + -0x18)) & 0xffffbdb5 | uVar2 & 0x424a;
  low.hi_ = b->lo_;
  high.lo_ = b->hi_;
  auStack_88 = (undefined1  [8])0x0;
  low.lo_ = 0;
  divisor.hi_ = 0;
  divisor.lo_ = uVar7;
  uint128::DivModImpl(*b,divisor,(uint128 *)&low.hi_,(uint128 *)auStack_88);
  high.hi_ = 0;
  mid.lo_ = 0;
  dividend.hi_ = high.lo_;
  dividend.lo_ = low.hi_;
  divisor_00.hi_ = 0;
  divisor_00.lo_ = uVar7;
  uint128::DivModImpl(dividend,divisor_00,(uint128 *)&low.hi_,(uint128 *)&high.hi_);
  if (low.hi_ == 0) {
    if (high.hi_ == 0) goto LAB_0016d8c5;
    std::ostream::_M_insert<unsigned_long>((ulong)&local_200);
    puVar1 = (uint *)((long)auStack_1e8 + *(long *)(local_200 + -0x18));
    *puVar1 = *puVar1 & 0xfffffdff;
    poVar5 = std::operator<<(&local_200,0x30);
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)&local_200);
    poVar5 = (ostream *)&local_200;
    puVar1 = (uint *)((long)auStack_1e8 + *(long *)(local_200 + -0x18));
    *puVar1 = *puVar1 & 0xfffffdff;
    poVar4 = std::operator<<(poVar5,0x30);
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = rep.field_2._8_8_;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  }
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = rep.field_2._8_8_;
LAB_0016d8c5:
  std::ostream::_M_insert<unsigned_long>((ulong)&local_200);
  std::__cxx11::stringbuf::str();
  pcVar3 = *(pointer *)(o + *(long *)(*(long *)o + -0x18) + 0x10);
  *(undefined8 *)(o + *(long *)(*(long *)o + -0x18) + 0x10) = 0;
  lVar8 = (long)pcVar3 - (long)rep._M_dataplus._M_p;
  if (rep._M_dataplus._M_p <= pcVar3 && lVar8 != 0) {
    cVar6 = (char)lVar8;
    if ((uVar2 & 0xb0) == 0x20) {
      std::ios::fill();
      std::__cxx11::string::append((ulong)&mid.hi_,cVar6);
    }
    else {
      std::ios::fill();
      std::__cxx11::string::insert((ulong)&mid.hi_,0,cVar6);
    }
  }
  poVar5 = std::operator<<(o,(string *)&mid.hi_);
  std::__cxx11::string::~string((string *)&mid.hi_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_200);
  return poVar5;
}

Assistant:

std::ostream& operator<<(std::ostream& o, const uint128& b) {
  std::ios_base::fmtflags flags = o.flags();

  // Select a divisor which is the largest power of the base < 2^64.
  uint128 div;
  std::streamsize div_base_log;
  switch (flags & std::ios::basefield) {
    case std::ios::hex:
      div =
          static_cast<uint64>(PROTOBUF_ULONGLONG(0x1000000000000000));  // 16^15
      div_base_log = 15;
      break;
    case std::ios::oct:
      div = static_cast<uint64>(
          PROTOBUF_ULONGLONG(01000000000000000000000));  // 8^21
      div_base_log = 21;
      break;
    default:  // std::ios::dec
      div = static_cast<uint64>(
          PROTOBUF_ULONGLONG(10000000000000000000));  // 10^19
      div_base_log = 19;
      break;
  }

  // Now piece together the uint128 representation from three chunks of
  // the original value, each less than "div" and therefore representable
  // as a uint64.
  std::ostringstream os;
  std::ios_base::fmtflags copy_mask =
      std::ios::basefield | std::ios::showbase | std::ios::uppercase;
  os.setf(flags & copy_mask, copy_mask);
  uint128 high = b;
  uint128 low;
  uint128::DivModImpl(high, div, &high, &low);
  uint128 mid;
  uint128::DivModImpl(high, div, &high, &mid);
  if (high.lo_ != 0) {
    os << high.lo_;
    os << std::noshowbase << std::setfill('0') << std::setw(div_base_log);
    os << mid.lo_;
    os << std::setw(div_base_log);
  } else if (mid.lo_ != 0) {
    os << mid.lo_;
    os << std::noshowbase << std::setfill('0') << std::setw(div_base_log);
  }
  os << low.lo_;
  std::string rep = os.str();

  // Add the requisite padding.
  std::streamsize width = o.width(0);
  if (width > rep.size()) {
    if ((flags & std::ios::adjustfield) == std::ios::left) {
      rep.append(width - rep.size(), o.fill());
    } else {
      rep.insert(static_cast<std::string::size_type>(0),
                 width - rep.size(), o.fill());
    }
  }

  // Stream the final representation in a single "<<" call.
  return o << rep;
}